

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O0

int Mop_ManMergeContainAll(Mop_Man_t *p,Vec_Wec_t *vGroups)

{
  int iVar1;
  Vec_Int_t *vGroup_00;
  Vec_Int_t *vGroup2_00;
  undefined4 local_34;
  undefined4 local_30;
  int Count;
  int k;
  int i;
  Vec_Int_t *vGroup2;
  Vec_Int_t *vGroup;
  Vec_Wec_t *vGroups_local;
  Mop_Man_t *p_local;
  
  local_34 = 0;
  for (Count = 0; iVar1 = Vec_WecSize(vGroups), Count < iVar1; Count = Count + 1) {
    vGroup_00 = Vec_WecEntry(vGroups,Count);
    iVar1 = Mop_ManRemoveIdentical(p,vGroup_00);
    local_34 = iVar1 + local_34;
    local_30 = Count;
    while( true ) {
      local_30 = local_30 + 1;
      iVar1 = Vec_WecSize(vGroups);
      if (iVar1 <= local_30) break;
      vGroup2_00 = Vec_WecEntry(vGroups,local_30);
      iVar1 = Mop_ManMergeContainTwo(p,vGroup_00,vGroup2_00);
      local_34 = iVar1 + local_34;
    }
  }
  return local_34;
}

Assistant:

int Mop_ManMergeContainAll( Mop_Man_t * p, Vec_Wec_t * vGroups )
{
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, Count = 0;
    Vec_WecForEachLevel( vGroups, vGroup, i )
    {
        Count += Mop_ManRemoveIdentical( p, vGroup );
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            Count += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    }
    return Count;
}